

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableModel::sort(QTableModel *this,int column,SortOrder order)

{
  iterator __first;
  int iVar1;
  int iVar2;
  qsizetype qVar3;
  QTableWidgetItem *pQVar4;
  reference ppQVar5;
  QList_conflict2 *in_RDI;
  long in_FS_OFFSET;
  int c;
  int r;
  int i;
  int numColumns;
  _func_bool_pair<QTableWidgetItem_ptr,_int>_ptr_pair<QTableWidgetItem_ptr,_int>_ptr *compare;
  int numRows;
  QModelIndexList to;
  QModelIndexList from;
  QList<QTableWidgetItem_*> sorted_table;
  QTableWidgetItem *itm;
  int row;
  QList<int> unsortable;
  QList<std::pair<QTableWidgetItem_*,_int>_> sortable;
  int in_stack_fffffffffffffe28;
  parameter_type in_stack_fffffffffffffe2c;
  QTableModel *in_stack_fffffffffffffe30;
  QList<QTableWidgetItem_*> *this_00;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 uVar6;
  iterator in_stack_fffffffffffffe40;
  undefined8 uVar7;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  LayoutChangeHint LVar8;
  undefined8 in_stack_fffffffffffffe50;
  QTableModel *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe98;
  int iVar9;
  undefined4 in_stack_fffffffffffffe9c;
  int local_160;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  QList<QTableWidgetItem_*> local_108 [3];
  undefined1 local_c0 [24];
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  QTableWidgetItem *local_60;
  int local_54;
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QList<std::pair<QTableWidgetItem_*,_int>_> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (pair<QTableWidgetItem_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<QTableWidgetItem_*,_int>_>::QList
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)0x8d69d9);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x8d6a13);
  QModelIndex::QModelIndex((QModelIndex *)0x8d6a20);
  iVar1 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,local_50);
  QList<std::pair<QTableWidgetItem_*,_int>_>::reserve
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffe58,
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  QList<int>::reserve((QList<int> *)in_stack_fffffffffffffe58,
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
    local_60 = item(in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                    (int)in_stack_fffffffffffffe50);
    if (local_60 == (QTableWidgetItem *)0x0) {
      QList<int>::append((QList<int> *)0x8d6add,in_stack_fffffffffffffe2c);
    }
    else {
      QList<std::pair<QTableWidgetItem*,int>>::emplace_back<QTableWidgetItem*&,int&>
                ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffe30,
                 (QTableWidgetItem **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 (int *)0x8d6ac7);
    }
  }
  QList<std::pair<QTableWidgetItem_*,_int>_>::begin
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffe30);
  QList<std::pair<QTableWidgetItem_*,_int>_>::end
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffe30);
  __first.i._4_4_ = in_stack_fffffffffffffe4c;
  __first.i._0_4_ = in_stack_fffffffffffffe48;
  std::
  stable_sort<QList<std::pair<QTableWidgetItem*,int>>::iterator,bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>
            (__first,in_stack_fffffffffffffe40,
             (_func_bool_pair<QTableWidgetItem_ptr,_int>_ptr_pair<QTableWidgetItem_ptr,_int>_ptr *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x18));
  QList<QTableWidgetItem_*>::QList
            ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffe30,
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8d6be5);
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8d6c1f);
  QModelIndex::QModelIndex((QModelIndex *)0x8d6c2c);
  iVar2 = (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,local_c0);
  QList<QModelIndex>::reserve
            ((QList<QModelIndex> *)in_stack_fffffffffffffe58,
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  QList<QModelIndex>::reserve
            ((QList<QModelIndex> *)in_stack_fffffffffffffe58,
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  for (local_160 = 0; local_160 < iVar1; local_160 = local_160 + 1) {
    qVar3 = QList<std::pair<QTableWidgetItem_*,_int>_>::size(&local_20);
    if (local_160 < qVar3) {
      QList<std::pair<QTableWidgetItem_*,_int>_>::at
                ((QList<std::pair<QTableWidgetItem_*,_int>_> *)in_stack_fffffffffffffe30,
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    else {
      QList<std::pair<QTableWidgetItem_*,_int>_>::size(&local_20);
      QList<int>::at((QList<int> *)in_stack_fffffffffffffe30,
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    for (iVar9 = 0; iVar9 < iVar2; iVar9 = iVar9 + 1) {
      pQVar4 = item(in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                    (int)in_stack_fffffffffffffe50);
      tableIndex(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
      ppQVar5 = QList<QTableWidgetItem_*>::operator[]
                          ((QList<QTableWidgetItem_*> *)in_stack_fffffffffffffe30,
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      *ppQVar5 = pQVar4;
      QAbstractItemModel::createIndex
                ((QAbstractItemModel *)in_stack_fffffffffffffe40.i,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe30);
      QList<QModelIndex>::append
                ((QList<QModelIndex> *)in_stack_fffffffffffffe30,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      QAbstractItemModel::createIndex
                ((QAbstractItemModel *)in_stack_fffffffffffffe40.i,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe30);
      QList<QModelIndex>::append
                ((QList<QModelIndex> *)in_stack_fffffffffffffe30,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
  }
  uVar6 = 0;
  uVar7 = 0;
  local_108[0].d.d = (Data *)0x0;
  local_108[0].d.ptr = (QTableWidgetItem **)0x0;
  local_108[0].d.size = 0;
  this_00 = local_108;
  QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8d6e1f);
  QAbstractItemModel::layoutAboutToBeChanged(in_RDI,(LayoutChangeHint)this_00);
  QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x8d6e41);
  QList<QTableWidgetItem_*>::operator=
            (this_00,(QList<QTableWidgetItem_*> *)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  QAbstractItemModel::changePersistentIndexList(in_RDI,(QList_conflict2 *)&local_90);
  local_118 = 0;
  LVar8 = (LayoutChangeHint)&local_128;
  local_128 = uVar6;
  uStack_120 = uVar7;
  QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8d6eab);
  QAbstractItemModel::layoutChanged(in_RDI,LVar8);
  QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x8d6ec8);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8d6ed2);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8d6edc);
  QList<QTableWidgetItem_*>::~QList((QList<QTableWidgetItem_*> *)0x8d6ee6);
  QList<int>::~QList((QList<int> *)0x8d6ef3);
  QList<std::pair<QTableWidgetItem_*,_int>_>::~QList
            ((QList<std::pair<QTableWidgetItem_*,_int>_> *)0x8d6f00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::sort(int column, Qt::SortOrder order)
{
    QList<std::pair<QTableWidgetItem *, int>> sortable;
    QList<int> unsortable;
    const int numRows = rowCount();

    sortable.reserve(numRows);
    unsortable.reserve(numRows);

    for (int row = 0; row < numRows; ++row) {
        if (QTableWidgetItem *itm = item(row, column))
            sortable.emplace_back(itm, row);
        else
            unsortable.append(row);
    }

    const auto compare = (order == Qt::AscendingOrder ? &itemLessThan : &itemGreaterThan);
    std::stable_sort(sortable.begin(), sortable.end(), compare);

    QList<QTableWidgetItem *> sorted_table(tableItems.size());
    QModelIndexList from;
    QModelIndexList to;
    const int numColumns = columnCount();
    from.reserve(numRows * numColumns);
    to.reserve(numRows * numColumns);
    for (int i = 0; i < numRows; ++i) {
        int r = (i < sortable.size()
                 ? sortable.at(i).second
                 : unsortable.at(i - sortable.size()));
        for (int c = 0; c < numColumns; ++c) {
            sorted_table[tableIndex(i, c)] = item(r, c);
            from.append(createIndex(r, c));
            to.append(createIndex(i, c));
        }
    }

    emit layoutAboutToBeChanged({}, QAbstractItemModel::VerticalSortHint);

    tableItems = sorted_table;
    changePersistentIndexList(from, to); // ### slow

    emit layoutChanged({}, QAbstractItemModel::VerticalSortHint);
}